

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KB.cpp
# Opt level: O2

bool __thiscall
components::KnowledgeBase::get_specific_percept_info
          (KnowledgeBase *this,pair<int,_int> room,constraint specific_knowledge)

{
  byte bVar1;
  bool bVar2;
  Knowledge KVar3;
  
  switch(specific_knowledge) {
  case stench:
    KVar3 = get_room_information(this,room);
    bVar1 = KVar3.stench;
    break;
  case breeze:
    bVar2 = get_information_breeze(this,room);
    return bVar2;
  case glitter:
    bVar2 = get_information_glitter(this,room);
    return bVar2;
  case bump:
    bVar2 = get_information_bump(this,room);
    return bVar2;
  case scream:
    bVar2 = get_information_scream(this,room);
    return bVar2;
  case wumpus:
    bVar2 = get_information_wumpus(this,room);
    return bVar2;
  case pit:
    KVar3 = get_room_information(this,room);
    bVar1 = KVar3.pit;
    break;
  default:
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool KnowledgeBase::get_specific_percept_info(std::pair<int, int> room, DataStructures::constraint specific_knowledge){
        if(specific_knowledge == DataStructures::constraint::breeze) return KnowledgeBase::get_information_breeze(room);
        else if(specific_knowledge == DataStructures::constraint::bump) return KnowledgeBase::get_information_bump(room);
        else if(specific_knowledge == DataStructures::constraint::glitter) return KnowledgeBase::get_information_glitter(room);
        else if(specific_knowledge == DataStructures::constraint::pit) return KnowledgeBase::get_information_pit(room);
        else if(specific_knowledge == DataStructures::constraint::scream) return KnowledgeBase::get_information_scream(room);
        else if(specific_knowledge == DataStructures::constraint::stench) return KnowledgeBase::get_information_stench(room);
        else if(specific_knowledge == DataStructures::constraint::wumpus) return KnowledgeBase::get_information_wumpus(room);
        else return false;
    }